

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O2

void tcg_out_branch(TCGContext_conflict9 *s,int call,tcg_insn_unit *dest)

{
  tcg_insn_unit *ptVar1;
  int *piVar2;
  intptr_t in_R8;
  int iVar3;
  
  ptVar1 = s->code_ptr;
  if (((long)dest - (long)ptVar1) + 0x7ffffffbU >> 0x20 == 0) {
    iVar3 = (int)((long)dest - (long)ptVar1) + -5;
    tcg_out_opc(s,(call == 0) + 0xe8,0,0,0);
  }
  else {
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = 0xff;
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = (call == 0) * '\x10' + '\x15';
    new_pool_label(s,(tcg_target_ulong)dest,(int)s->code_ptr,ptVar1,in_R8);
    iVar3 = 0;
  }
  piVar2 = (int *)s->code_ptr;
  *piVar2 = iVar3;
  s->code_ptr = (tcg_insn_unit *)(piVar2 + 1);
  return;
}

Assistant:

static void tcg_out_branch(TCGContext *s, int call, tcg_insn_unit *dest)
{
    intptr_t disp = tcg_pcrel_diff(s, dest) - 5;

    if (disp == (int32_t)disp) {
        tcg_out_opc(s, call ? OPC_CALL_Jz : OPC_JMP_long, 0, 0, 0);
        tcg_out32(s, disp);
    } else {
        /* rip-relative addressing into the constant pool.
           This is 6 + 8 = 14 bytes, as compared to using an
           an immediate load 10 + 6 = 16 bytes, plus we may
           be able to re-use the pool constant for more calls.  */
        tcg_out_opc(s, OPC_GRP5, 0, 0, 0);
        tcg_out8(s, (call ? EXT5_CALLN_Ev : EXT5_JMPN_Ev) << 3 | 5);
        new_pool_label(s, (uintptr_t)dest, R_386_PC32, s->code_ptr, -4);
        tcg_out32(s, 0);
    }
}